

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O3

void null_line_error(Terminal *term,wchar_t y,wchar_t lineno,tree234 *whichtree,wchar_t treeindex,
                    char *varname)

{
  wchar_t wVar1;
  wchar_t wVar2;
  tree234 *t;
  tree234 *t_00;
  tree234 *t_01;
  int iVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 in_register_00000084;
  
  wVar1 = term->cols;
  wVar2 = term->rows;
  t = term->scrollback;
  iVar3 = count234(t);
  t_00 = term->screen;
  iVar4 = count234(t_00);
  t_01 = term->alt_screen;
  uVar5 = count234(t_01);
  modalfatalbox("%s==NULL in terminal.c\nlineno=%d y=%d w=%d h=%d\ncount(scrollback=%p)=%d\ncount(screen=%p)=%d\ncount(alt=%p)=%d alt_sblines=%d\nwhichtree=%p treeindex=%d\ncommitid=%s\n\nPlease contact <putty@projects.tartarus.org> and pass on the above information."
                ,varname,(ulong)(uint)lineno,(ulong)(uint)y,(ulong)(uint)wVar1,(ulong)(uint)wVar2,t,
                CONCAT44(extraout_var,iVar3),t_00,CONCAT44(extraout_var_00,iVar4),t_01,(ulong)uVar5,
                (ulong)(uint)term->alt_sblines,whichtree,CONCAT44(in_register_00000084,treeindex),
                "a33cf2240ef44c68537b116440c3184460e62bff");
}

Assistant:

static void null_line_error(Terminal *term, int y, int lineno,
                            tree234 *whichtree, int treeindex,
                            const char *varname)
{
    modalfatalbox("%s==NULL in terminal.c\n"
                  "lineno=%d y=%d w=%d h=%d\n"
                  "count(scrollback=%p)=%d\n"
                  "count(screen=%p)=%d\n"
                  "count(alt=%p)=%d alt_sblines=%d\n"
                  "whichtree=%p treeindex=%d\n"
                  "commitid=%s\n\n"
                  "Please contact <putty@projects.tartarus.org> "
                  "and pass on the above information.",
                  varname, lineno, y, term->cols, term->rows,
                  term->scrollback, count234(term->scrollback),
                  term->screen, count234(term->screen),
                  term->alt_screen, count234(term->alt_screen),
                  term->alt_sblines, whichtree, treeindex, commitid);
}